

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YolactDetector.cpp
# Opt level: O1

int __thiscall
Yolact::draw(Yolact *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects)

{
  undefined2 uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  double dVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [12];
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  int iVar15;
  size_t sVar16;
  long lVar17;
  byte *pbVar18;
  pointer pOVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  undefined2 uVar47;
  double dVar23;
  undefined1 auVar33 [16];
  __m128d t;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined1 uVar46;
  int baseLine;
  undefined1 local_1f8 [16];
  long alStack_1e8 [3];
  int local_1cc;
  Size label_size;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined4 local_198 [2];
  undefined1 local_190 [16];
  vector<Object,_std::allocator<Object>_> *local_180;
  double local_178;
  long local_170;
  double local_168;
  double dStack_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  char text [256];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar34 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar35 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar24 [16];
  
  local_170 = 0;
  iVar15 = 0;
  local_180 = objects;
  do {
    pOVar19 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
              super__Vector_impl_data._M_start;
    dVar23 = (double)pOVar19[local_170].prob;
    if (0.15 <= dVar23) {
      pOVar19 = pOVar19 + local_170;
      dVar5 = (double)(pOVar19->rect).y;
      uVar42 = SUB81(dVar5,0);
      uVar44 = (char)((ulong)dVar5 >> 8);
      uVar46 = (char)((ulong)dVar5 >> 0x10);
      uVar10 = (char)((ulong)dVar5 >> 0x18);
      uVar11 = (char)((ulong)dVar5 >> 0x20);
      uVar12 = (char)((ulong)dVar5 >> 0x28);
      uVar13 = (char)((ulong)dVar5 >> 0x30);
      uVar14 = (char)((ulong)dVar5 >> 0x38);
      fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",dVar23,(double)(pOVar19->rect).x,
              CONCAT17(uVar45,CONCAT16(uVar43,CONCAT15(uVar41,CONCAT14(uVar40,CONCAT13(uVar39,
                                                  CONCAT12(uVar38,CONCAT11(uVar37,uVar36))))))),
              (double)(pOVar19->rect).width,(double)(pOVar19->rect).height,pOVar19->label);
      uVar45 = uVar14;
      uVar43 = uVar13;
      uVar41 = uVar12;
      uVar40 = uVar11;
      uVar39 = uVar10;
      uVar38 = uVar46;
      uVar37 = uVar44;
      uVar36 = uVar42;
      auVar7 = local_1f8;
      uVar4 = CONCAT13(uVar39,CONCAT12(uVar38,CONCAT11(uVar37,uVar36))) ^
              CONCAT13(uVar39,CONCAT12(uVar38,CONCAT11(uVar37,uVar36)));
      uVar6 = CONCAT13(uVar45,CONCAT12(uVar43,CONCAT11(uVar41,uVar40))) ^
              CONCAT13(uVar45,CONCAT12(uVar43,CONCAT11(uVar41,uVar40)));
      uVar42 = (undefined1)(uVar6 >> 8);
      uVar44 = (undefined1)(uVar6 >> 0x10);
      uVar46 = (undefined1)(uVar6 >> 0x18);
      local_1f8[0xc] = (char)uVar6;
      local_1f8._8_4_ = uVar4;
      local_1f8[0xd] = uVar42;
      local_1f8[0xe] = uVar44;
      local_1f8[0xf] = uVar46;
      local_1f8._0_8_ = auVar7._0_8_;
      alStack_1e8[0] = 0;
      local_1f8._0_4_ = 0x3010000;
      local_1a8 = (int)ROUND((pOVar19->rect).x);
      local_1a4 = (int)ROUND((pOVar19->rect).y);
      local_1a0 = (int)ROUND((pOVar19->rect).width);
      local_19c = (int)ROUND((pOVar19->rect).height);
      local_178 = (double)draw::colors[iVar15][2];
      uVar1 = *(undefined2 *)draw::colors[iVar15];
      auVar32._0_15_ = ZEXT415(0);
      auVar32[0xf] = uVar46;
      auVar31._14_2_ = auVar32._14_2_;
      auVar31._0_13_ = ZEXT413(0);
      auVar31[0xd] = uVar44;
      auVar30._13_3_ = auVar31._13_3_;
      auVar30._0_13_ = ZEXT413(0);
      auVar29._12_4_ = auVar30._12_4_;
      auVar29._0_11_ = ZEXT411(0);
      auVar29[0xb] = uVar42;
      auVar28._11_5_ = auVar29._11_5_;
      auVar28._0_11_ = ZEXT411(0);
      auVar27._10_6_ = auVar28._10_6_;
      auVar27._0_9_ = (unkuint9)0;
      auVar27[9] = (char)uVar6;
      auVar26._9_7_ = auVar27._9_7_;
      auVar26._0_9_ = (unkuint9)0;
      auVar8._1_8_ = auVar26._8_8_;
      auVar8[0] = (char)(uVar4 >> 0x18);
      auVar8._9_7_ = 0;
      auVar7._1_10_ = SUB1610(auVar8 << 0x38,6);
      auVar7[0] = (char)(uVar4 >> 0x10);
      auVar7._11_5_ = 0;
      auVar25._4_12_ = SUB1612(auVar7 << 0x28,4);
      auVar25[3] = (char)(uVar4 >> 8);
      auVar25[2] = (char)((ushort)uVar1 >> 8);
      auVar25._0_2_ = uVar1;
      auVar24._2_14_ = auVar25._2_14_;
      uVar47 = CONCAT11((char)uVar4,(char)uVar1);
      auVar35._0_12_ = auVar24._0_12_;
      auVar35._12_2_ = SUB162(auVar8 << 0x38,6);
      auVar35._14_2_ = (short)(uVar6 >> 0x10);
      auVar34._12_4_ = auVar35._12_4_;
      auVar34._0_10_ = auVar24._0_10_;
      auVar34._10_2_ = (short)uVar6;
      auVar33._10_6_ = auVar34._10_6_;
      auVar33._0_8_ = auVar24._0_8_;
      auVar33._8_2_ = SUB162(auVar7 << 0x28,4);
      auVar9._4_8_ = auVar33._8_8_;
      auVar9._2_2_ = (short)(uVar4 >> 0x10);
      auVar9._0_2_ = auVar25._2_2_;
      local_168 = (double)CONCAT22((short)uVar4,uVar47);
      dStack_160 = (double)auVar9._0_4_;
      text[0x18] = '\0';
      text[0x19] = '\0';
      text[0x1a] = '\0';
      text[0x1b] = '\0';
      text[0x1c] = '\0';
      text[0x1d] = '\0';
      text[0x1e] = '\0';
      text[0x1f] = '\0';
      local_1cc = iVar15;
      text._0_8_ = local_168;
      text._8_8_ = dStack_160;
      text._16_8_ = local_178;
      local_1f8._8_8_ = image;
      cv::rectangle((string *)local_1f8,&local_1a8,text,1,8,0);
      sprintf(text,"%s %.1f%%",(double)(pOVar19->prob * 100.0),draw::class_names[pOVar19->label]);
      local_1f8._0_8_ = alStack_1e8;
      sVar16 = strlen(text);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,text,text + sVar16);
      cv::getTextSize((string *)&label_size,(int)(string *)local_1f8,0.5,0,(int *)0x1);
      if ((long *)local_1f8._0_8_ != alStack_1e8) {
        operator_delete((void *)local_1f8._0_8_,alStack_1e8[0] + 1);
      }
      iVar15 = (int)(pOVar19->rect).x;
      iVar22 = (int)(((pOVar19->rect).y - (float)label_size.height) - 0.0);
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      iVar20 = *(int *)(image + 0xc) - label_size.width;
      if (label_size.width + iVar15 <= *(int *)(image + 0xc)) {
        iVar20 = iVar15;
      }
      local_198[0] = 0x3010000;
      local_190._8_8_ = 0;
      local_190._0_8_ = image;
      local_1b0 = label_size.width;
      local_1f8 = _DAT_00186200;
      alStack_1e8[0] = 0x406fe00000000000;
      alStack_1e8[1] = 0;
      local_1b8 = iVar20;
      local_1b4 = iVar22;
      cv::rectangle(local_198,&local_1b8,(string *)local_1f8,0xffffffff,8,0);
      local_198[0] = 0x3010000;
      local_190._8_8_ = 0;
      local_1f8._0_8_ = alStack_1e8;
      sVar16 = strlen(text);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,text,text + sVar16);
      local_1bc = iVar22 + label_size.height;
      local_158._0_12_ = ZEXT812(0);
      local_158._12_4_ = 0;
      local_1c0 = iVar20;
      local_148 = local_158;
      cv::putText(0x3fe0000000000000,local_198,(string *)local_1f8,&local_1c0,0,local_158);
      if ((long *)local_1f8._0_8_ != alStack_1e8) {
        operator_delete((void *)local_1f8._0_8_,alStack_1e8[0] + 1);
      }
      if (0 < *(int *)(image + 8)) {
        lVar17 = 0;
        do {
          if (0 < *(int *)(image + 0xc)) {
            lVar2 = **(long **)&pOVar19->field_0x78;
            lVar3 = *(long *)&pOVar19->field_0x40;
            pbVar18 = (byte *)(*(long *)(image + 0x10) + **(long **)(image + 0x48) * lVar17 + 2);
            lVar21 = 0;
            do {
              if (*(char *)(lVar2 * lVar17 + lVar3 + lVar21) == -1) {
                iVar15 = (int)ROUND((double)pbVar18[-2] * 0.5 + local_168 * 0.5);
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                if (0xfe < iVar15) {
                  iVar15 = 0xff;
                }
                pbVar18[-2] = (byte)iVar15;
                iVar15 = (int)ROUND((double)pbVar18[-1] * 0.5 + dStack_160 * 0.5);
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                if (0xfe < iVar15) {
                  iVar15 = 0xff;
                }
                pbVar18[-1] = (byte)iVar15;
                iVar15 = (int)ROUND((double)*pbVar18 * 0.5 + local_178 * 0.5);
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                if (0xfe < iVar15) {
                  iVar15 = 0xff;
                }
                *pbVar18 = (byte)iVar15;
              }
              lVar21 = lVar21 + 1;
              pbVar18 = pbVar18 + 3;
            } while (lVar21 < *(int *)(image + 0xc));
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(int *)(image + 8));
      }
      iVar15 = local_1cc + 1;
      objects = local_180;
    }
    local_170 = local_170 + 1;
  } while( true );
}

Assistant:

int Yolact::draw(cv::Mat& image, const std::vector<Object>& objects) 
{
    static const char* class_names[] = {"background",
                                        "person", "bicycle", "car", "motorcycle", "airplane", "bus",
                                        "train", "truck", "boat", "traffic light", "fire hydrant",
                                        "stop sign", "parking meter", "bench", "bird", "cat", "dog",
                                        "horse", "sheep", "cow", "elephant", "bear", "zebra", "giraffe",
                                        "backpack", "umbrella", "handbag", "tie", "suitcase", "frisbee",
                                        "skis", "snowboard", "sports ball", "kite", "baseball bat",
                                        "baseball glove", "skateboard", "surfboard", "tennis racket",
                                        "bottle", "wine glass", "cup", "fork", "knife", "spoon", "bowl",
                                        "banana", "apple", "sandwich", "orange", "broccoli", "carrot",
                                        "hot dog", "pizza", "donut", "cake", "chair", "couch",
                                        "potted plant", "bed", "dining table", "toilet", "tv", "laptop",
                                        "mouse", "remote", "keyboard", "cell phone", "microwave", "oven",
                                        "toaster", "sink", "refrigerator", "book", "clock", "vase",
                                        "scissors", "teddy bear", "hair drier", "toothbrush"
                                       };

    static const unsigned char colors[19][3] = {
        {244, 67, 54},
        {233, 30, 99},
        {156, 39, 176},
        {103, 58, 183},
        {63, 81, 181},
        {33, 150, 243},
        {3, 169, 244},
        {0, 188, 212},
        {0, 150, 136},
        {76, 175, 80},
        {139, 195, 74},
        {205, 220, 57},
        {255, 235, 59},
        {255, 193, 7},
        {255, 152, 0},
        {255, 87, 34},
        {121, 85, 72},
        {158, 158, 158},
        {96, 125, 139}
    };

    //cv::Mat image = bgr.clone();

    int color_index = 0;

    for (size_t i = 0; i < objects.size(); i++)
    {
        const Object& obj = objects[i];

        if (obj.prob < 0.15)
            continue;

        fprintf(stderr, "%d = %.5f at %.2f %.2f %.2f x %.2f\n", obj.label, obj.prob,
                obj.rect.x, obj.rect.y, obj.rect.width, obj.rect.height);

        const unsigned char* color = colors[color_index++];

        cv::rectangle(image, obj.rect, cv::Scalar(color[0], color[1], color[2]));

        char text[256];
        sprintf(text, "%s %.1f%%", class_names[obj.label], obj.prob * 100);

        int baseLine = 0;
        cv::Size label_size = cv::getTextSize(text, cv::FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);

        int x = obj.rect.x;
        int y = obj.rect.y - label_size.height - baseLine;
        if (y < 0)
            y = 0;
        if (x + label_size.width > image.cols)
            x = image.cols - label_size.width;

        cv::rectangle(image, cv::Rect(cv::Point(x, y), cv::Size(label_size.width, label_size.height + baseLine)),
                      cv::Scalar(255, 255, 255), -1);

        cv::putText(image, text, cv::Point(x, y + label_size.height),
                    cv::FONT_HERSHEY_SIMPLEX, 0.5, cv::Scalar(0, 0, 0));

        // draw mask
        for (int y = 0; y < image.rows; y++)
        {
            const uchar* mp = obj.mask.ptr(y);
            uchar* p = image.ptr(y);
            for (int x = 0; x < image.cols; x++)
            {
                if (mp[x] == 255)
                {
                    p[0] = cv::saturate_cast<uchar>(p[0] * 0.5 + color[0] * 0.5);
                    p[1] = cv::saturate_cast<uchar>(p[1] * 0.5 + color[1] * 0.5);
                    p[2] = cv::saturate_cast<uchar>(p[2] * 0.5 + color[2] * 0.5);
                }
                p += 3;
            }
        }
    }

    // cv::imwrite("result.png", image);
    // cv::imshow("image", image);
    // cv::waitKey(0);
}